

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O0

uint32_t * __thiscall
FastPForLib::Simple16<false>::decodeArray
          (Simple16<false> *this,uint32_t *in,size_t param_3,uint32_t *out,size_t *nvalue)

{
  uint32_t uVar1;
  ulong uVar2;
  ulong in_RCX;
  uint32_t *in_RSI;
  ulong *in_R8;
  uint32_t *end;
  uint32_t actualvalue;
  ulong local_20 [2];
  uint32_t *local_10 [2];
  
  uVar2 = *in_R8;
  local_20[0] = in_RCX;
  local_10[0] = in_RSI;
  if (*in_R8 < (uVar2 & 0xffffffff)) {
    fprintf(_stderr,"possible overrun\n");
  }
  *in_R8 = uVar2 & 0xffffffff;
  uVar2 = local_20[0] + *in_R8 * 4;
  while (local_20[0] < uVar2) {
    uVar1 = which(local_10[0]);
    (**(code **)(unpackarray + (ulong)uVar1 * 8))(local_20,local_10);
  }
  return local_10[0];
}

Assistant:

const uint32_t *Simple16<MarkLength>::decodeArray(const uint32_t *in,
#ifndef NDEBUG
                                                  const size_t len,
                                                  uint32_t *out,
                                                  size_t &nvalue) {
#else
                                                  const size_t, uint32_t *out,
                                                  size_t &nvalue) {
#endif
#ifndef NDEBUG
  const uint32_t *const endin = in + len;
#endif
  if (MarkLength)
    if ((*in) > nvalue)
      throw NotEnoughStorage(*in);
  const uint32_t actualvalue =
      MarkLength ? *(in++) : static_cast<uint32_t>(nvalue);
  if (nvalue < actualvalue)
    fprintf(stderr, "possible overrun\n");
  nvalue = actualvalue;
#ifdef STATS
  printf("simple16 decode %zu\n", len);
  std::vector<uint32_t> stats(16, 0);
#endif
  const uint32_t *const end = out + nvalue;
  while (end > out) {
#ifdef STATS
    stats[which(in)]++;
#endif
    (unpackarray[which(in)])(&out, &in);
  }

#ifdef STATS
  uint32_t sum = std::accumulate(stats.begin(), stats.end(), 0);
  for (uint32_t k = 0; k < stats.size(); ++k) {
    printf("simple16 stats[%u]=%f\n", k, stats[k] * 1.0 / sum);
  }
#endif
  ASSERT(in <= endin, std::to_string(in - endin));
  return in;
}